

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O3

void __thiscall
ExampleNLFeeder::
FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
          (ExampleNLFeeder *this,int i,DefVarWriterFactory *dvw)

{
  double dVar1;
  int i_00;
  ExampleModel *pEVar2;
  bool bVar3;
  long lVar4;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this_00;
  bool bVar5;
  int *piVar6;
  DefVarWriter DVar7;
  ExprArgWriter ew;
  vector<int,_std::allocator<int>_> local_58;
  ExprArgWriter local_40;
  
  ExampleModel::DefVarsInItem(&local_58,this->mdl_,i);
  for (piVar6 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
    i_00 = *piVar6;
    pEVar2 = this->mdl_;
    DVar7 = mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
            DefVarWriterFactory::StartDefVar
                      (dvw,i_00 + 2,
                       (-(uint)(pEVar2->dvar_linpart[i_00][1] != 0.0) & 1) +
                       (uint)(pEVar2->dvar_linpart[i_00][0] != 0.0),pEVar2->dvar_name[i_00]);
    this_00 = DVar7.nlw_;
    pEVar2 = this->mdl_;
    lVar4 = 0;
    bVar3 = true;
    do {
      bVar5 = bVar3;
      dVar1 = pEVar2->dvar_linpart[i_00][lVar4];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        mp::BinaryFormatter::apr(&this_00->super_FormatterType,&this_00->nm,"%d %g\n");
      }
      lVar4 = 1;
      bVar3 = false;
    } while (bVar5);
    local_40.nargs_ = 1;
    local_40.nlw_ = this_00;
    ExampleModel::
    WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this->mdl_,i_00,&local_40);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FeedDefinedVariables(int i, DefVarWriterFactory& dvw) {
    for (int dvar0: Model().DefVarsInItem(i)) {
      int lin_nnz = CountNNZ(Model().dvar_linpart[dvar0]);
      auto dv = dvw.StartDefVar(
            dvar0 + Model().n_var,  // index after direct vars
            lin_nnz, Model().dvar_name[dvar0]);
      /////////// Write the linear part:
      auto linw = dv.GetLinExprWriter();
      WriteDense2Sparse_Pure(linw,
                             Model().dvar_linpart[dvar0]);
      /////////// Write the expression tree:
      auto ew = dv.GetExprWriter();
      Model().WriteDVarExpr(dvar0, ew);
    }
  }